

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O3

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::MLoopCol>
          (Structure *this,MLoopCol *dest,FileDatabase *db)

{
  ReadField<1,unsigned_char>(this,&dest->r,"r",db);
  ReadField<1,unsigned_char>(this,&dest->g,"g",db);
  ReadField<1,unsigned_char>(this,&dest->b,"b",db);
  ReadField<1,unsigned_char>(this,&dest->a,"a",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<MLoopCol> (
    MLoopCol& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Igno>(dest.r,"r",db);
    ReadField<ErrorPolicy_Igno>(dest.g,"g",db);
    ReadField<ErrorPolicy_Igno>(dest.b,"b",db);
    ReadField<ErrorPolicy_Igno>(dest.a,"a",db);

    db.reader->IncPtr(size);
}